

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O0

error<idx2::err_code> idx2::ReadVolume(cstr FileName,v3i *Dims3,dtype Type,volume *Volume)

{
  undefined1 uVar1;
  error<idx2::err_code> eVar2;
  error<idx2::err_code> eVar3;
  cstr local_2b8;
  err_code local_2b0;
  undefined2 uStack_2ac;
  anon_class_1_0_00000001 local_2a1;
  error<idx2::err_code> local_2a0;
  anon_class_1_0_00000001 local_289;
  grid local_288;
  grid local_270;
  undefined4 local_254;
  error<idx2::err_code> local_250;
  cstr local_230;
  err_code local_228;
  undefined2 local_224;
  undefined1 local_220 [8];
  scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_Volume_cpp:47:5)>
  __ScopeGuard__47;
  anon_class_8_1_898364f2_for_Func __CleanUpFunc__47;
  volume Temp;
  cstr local_1b8;
  err_code local_1b0;
  undefined2 uStack_1ac;
  undefined1 local_198 [8];
  error<idx2::err_code> Ok;
  volume *Volume_local;
  dtype Type_local;
  v3i *Dims3_local;
  cstr FileName_local;
  err_code local_160;
  undefined2 uStack_15c;
  undefined2 uStack_15a;
  int local_140;
  long local_120;
  long local_118;
  long local_110;
  allocator *local_108;
  undefined1 local_f9;
  v3i *local_f8;
  buffer *local_f0;
  undefined1 local_e1;
  int local_e0;
  undefined4 local_dc;
  undefined4 local_d8;
  undefined4 local_d4;
  v3i *local_d0;
  grid *local_c8;
  undefined4 local_bc;
  undefined4 local_b8;
  undefined4 local_b4;
  v3i *local_b0;
  grid *local_a8;
  long *local_a0;
  v3i *local_98;
  long *local_90;
  undefined4 *local_88;
  undefined4 *local_80;
  v3i *local_78;
  v3i *local_70;
  mallocator *local_68;
  buffer *local_60;
  v3i *local_58;
  grid *local_50;
  v3i *local_48;
  v3i *local_40;
  grid *local_38;
  v3i *local_30;
  undefined4 local_24;
  undefined4 *local_20;
  undefined4 local_14;
  undefined4 *local_10;
  
  Ok._8_8_ = Volume;
  error<idx2::err_code>::error((error<idx2::err_code> *)local_198);
  switch(Type) {
  case int8:
  case uint8:
    local_140 = 1;
    break;
  case int16:
  case uint16:
    local_140 = 2;
    break;
  case int32:
  case uint32:
  case float32:
    local_140 = 4;
    break;
  case int64:
  case uint64:
  case float64:
    local_140 = 8;
    break;
  default:
    local_140 = 0;
  }
  if ((long)((Dims3->field_0).field_0.X * (Dims3->field_0).field_0.Y * (Dims3->field_0).field_0.Z *
            local_140) < *(long *)(Ok._8_8_ + 8)) {
    uVar1 = *(undefined1 *)(Ok._8_8_ + 0x20);
    local_108 = &Mallocator()->super_allocator;
    local_f9 = uVar1;
    local_f8 = Dims3;
    local_f0 = (buffer *)&__CleanUpFunc__47;
    local_68 = Mallocator();
    __CleanUpFunc__47.Temp = (volume *)0x0;
    Temp.Buffer.Data = (byte *)0x0;
    local_78 = local_f8;
    Temp.Buffer.Alloc =
         (allocator *)
         ((ulong)((local_f8->field_0).field_0.X & 0x1fffff) |
          (ulong)((local_f8->field_0).field_0.Y & 0x1fffff) << 0x15 |
         (ulong)((local_f8->field_0).field_0.Z & 0x1fffff) << 0x2a);
    Temp.Dims._0_1_ = local_f9;
    local_e1 = local_f9;
    switch(local_f9) {
    case 0:
    case 1:
      local_e0 = 1;
      break;
    case 2:
    case 3:
      local_e0 = 2;
      break;
    case 4:
    case 5:
    case 8:
      local_e0 = 4;
      break;
    case 6:
    case 7:
    case 9:
      local_e0 = 8;
      break;
    default:
      local_e0 = 0;
    }
    local_a0 = &local_120;
    local_98 = local_f8;
    local_120 = (long)(local_f8->field_0).field_0.X;
    local_118 = (long)(local_f8->field_0).field_0.Y;
    local_110 = (long)(local_f8->field_0).field_0.Z;
    local_90 = local_a0;
    local_60 = (buffer *)&__CleanUpFunc__47;
    Temp.Buffer.Bytes = (i64)local_68;
    AllocBuf((buffer *)&__CleanUpFunc__47,(long)local_e0 * local_120 * local_118 * local_110,
             local_108);
    __ScopeGuard__47._8_8_ = (buffer *)&__CleanUpFunc__47;
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Volume.cpp:47:5)>
    ::scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_Volume_cpp:47:5)>
                   *)local_220,(anon_class_8_1_898364f2_for_Func *)&__ScopeGuard__47.Dismissed);
    eVar3 = ReadFile(FileName,(buffer *)&__CleanUpFunc__47);
    eVar2.Code = local_2a0.Code;
    eVar2.StackIdx = local_2a0.StackIdx;
    eVar2.StrGened = local_2a0.StrGened;
    eVar2._14_2_ = local_2a0._14_2_;
    eVar2.Msg = local_2a0.Msg;
    local_230 = eVar3.Msg;
    local_250.Code = eVar3.Code;
    local_228 = local_250.Code;
    local_250._12_2_ = eVar3._12_2_;
    local_224._0_1_ = local_250.StackIdx;
    local_224._1_1_ = local_250.StrGened;
    Ok.Msg._0_4_ = local_250.Code;
    Ok.Msg._4_1_ = local_250.StackIdx;
    Ok.Msg._5_1_ = local_250.StrGened;
    local_198 = (undefined1  [8])local_230;
    local_250 = eVar3;
    if (local_250.Code == NoError) {
      if (*(char *)(Ok._8_8_ + 0x20) == '\b') {
        local_c8 = &local_270;
        local_270.super_extent.From = 0;
        local_270.super_extent.Dims =
             (long)(int)((Dims3->field_0).field_0.X & 0x1fffff) +
             (long)(int)((Dims3->field_0).field_0.Y & 0x1fffff) * 0x200000 +
             ((long)(int)((Dims3->field_0).field_0.Z & 0x1fffff) << 0x2a);
        local_10 = &local_dc;
        local_14 = 1;
        local_dc = 1;
        local_d8 = 1;
        local_d4 = 1;
        local_80 = &local_dc;
        local_270.Strd = 0x40000200001;
        local_d0 = Dims3;
        local_40 = Dims3;
        local_38 = local_c8;
        local_30 = Dims3;
        Copy<float>(&local_270,(volume *)&__CleanUpFunc__47,(volume *)Ok._8_8_);
      }
      else if (*(char *)(Ok._8_8_ + 0x20) == '\t') {
        local_a8 = &local_288;
        local_288.super_extent.From = 0;
        local_288.super_extent.Dims =
             (long)(int)((Dims3->field_0).field_0.X & 0x1fffff) +
             (long)(int)((Dims3->field_0).field_0.Y & 0x1fffff) * 0x200000 +
             ((long)(int)((Dims3->field_0).field_0.Z & 0x1fffff) << 0x2a);
        local_20 = &local_bc;
        local_24 = 1;
        local_bc = 1;
        local_b8 = 1;
        local_b4 = 1;
        local_88 = &local_bc;
        local_288.Strd = 0x40000200001;
        local_b0 = Dims3;
        local_58 = Dims3;
        local_50 = local_a8;
        local_48 = Dims3;
        Copy<double>(&local_288,(volume *)&__CleanUpFunc__47,(volume *)Ok._8_8_);
      }
      eVar2 = ReadVolume::anon_class_1_0_00000001::operator()(&local_289);
      FileName_local = eVar2.Msg;
      local_2a0.Code = eVar2.Code;
      local_160 = local_2a0.Code;
      local_2a0._12_2_ = eVar2._12_2_;
      uStack_15c._0_1_ = local_2a0.StackIdx;
      uStack_15c._1_1_ = local_2a0.StrGened;
    }
    else {
      uStack_15a = Ok.Msg._6_2_;
      FileName_local = local_230;
      local_160 = local_250.Code;
      uStack_15c = local_250._12_2_;
    }
    local_254 = 1;
    local_2a0 = eVar2;
    scope_guard<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Volume.cpp:47:5)>
    ::~scope_guard((scope_guard<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_sci_visus[P]idx2_Source_Core_Volume_cpp:47:5)>
                    *)local_220);
  }
  else {
    eVar2 = ReadFile(FileName,(buffer *)Ok._8_8_);
    local_1b8 = eVar2.Msg;
    local_1b0 = eVar2.Code;
    uStack_1ac = eVar2._12_2_;
    local_198 = (undefined1  [8])local_1b8;
    Ok.Msg._0_4_ = local_1b0;
    Ok.Msg._4_2_ = uStack_1ac;
    if (local_1b0 == NoError) {
      Temp._32_8_ = *(undefined8 *)Ok._8_8_;
      local_70 = Dims3;
      memcpy((void *)Ok._8_8_,&Temp.Type,0x21);
      eVar2 = ReadVolume::anon_class_1_0_00000001::operator()(&local_2a1);
      local_2b8 = eVar2.Msg;
      FileName_local = local_2b8;
      local_2b0 = eVar2.Code;
      local_160 = local_2b0;
      uStack_2ac = eVar2._12_2_;
      uStack_15c = uStack_2ac;
    }
    else {
      FileName_local = local_1b8;
      uStack_15a = Ok.Msg._6_2_;
      local_160 = local_1b0;
      uStack_15c = uStack_1ac;
    }
  }
  eVar3.Code = local_160;
  eVar3.Msg = FileName_local;
  eVar3.StackIdx = (undefined1)uStack_15c;
  eVar3.StrGened = (bool)uStack_15c._1_1_;
  eVar3._14_2_ = uStack_15a;
  return eVar3;
}

Assistant:

error<>
ReadVolume(cstr FileName, const v3i& Dims3, dtype Type, volume* Volume)
{
  error Ok;
  if (Size(Volume->Buffer) <= Prod(Dims3) * SizeOf(Type))
  {
    Ok = ReadFile(FileName, &Volume->Buffer);
    if (Ok.Code != err_code::NoError)
      return Ok;
    *Volume = volume(Volume->Buffer, Dims3, Type);
  }
  else
  { // volume's buffer is larger than the input
    idx2_Assert(Dims3 <= Dims(*Volume));
    idx2_Assert(Volume->Type != dtype::__Invalid__);
    volume Temp(Dims3, Volume->Type);
    idx2_CleanUp(Dealloc(&Temp));
    Ok = ReadFile(FileName, &Temp.Buffer);
    if (Ok.Code != err_code::NoError)
      return Ok;
    if (Volume->Type == dtype::float32)
      Copy<f32>(grid(Dims3), Temp, Volume);
    else if (Volume->Type == dtype::float64)
      Copy<f64>(grid(Dims3), Temp, Volume);
    return idx2_Error(err_code::NoError);
  }
  return idx2_Error(err_code::NoError);
}